

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

vector<char,_std::allocator<char>_> * __thiscall
FBX::Decoder::readArray<char>
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,Decoder *this)

{
  undefined1 __src [8];
  uint uVar1;
  char *__dest;
  size_t __n;
  Span<char> SVar2;
  undefined1 local_80 [8];
  Span<char> data;
  Span<char> local_60;
  vector<char,_std::allocator<char>_> local_50;
  undefined1 local_31;
  size_t local_30;
  size_t completeLength;
  size_t encoding;
  size_t arraySize;
  Decoder *this_local;
  vector<char,_std::allocator<char>_> *buffer;
  
  arraySize = (size_t)this;
  this_local = (Decoder *)__return_storage_ptr__;
  uVar1 = Stream::read<unsigned_int>(&this->stream);
  encoding = (size_t)uVar1;
  uVar1 = Stream::read<unsigned_int>(&this->stream);
  completeLength = (size_t)uVar1;
  uVar1 = Stream::read<unsigned_int>(&this->stream);
  local_30 = (size_t)uVar1;
  local_31 = 0;
  std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__);
  if (completeLength == 1) {
    local_60 = Stream::read<char>(&this->stream,local_30);
    decompress<char>(&local_50,this,&local_60);
    std::vector<char,_std::allocator<char>_>::operator=(__return_storage_ptr__,&local_50);
    std::vector<char,_std::allocator<char>_>::~vector(&local_50);
  }
  else {
    SVar2 = Stream::read<char>(&this->stream,local_30);
    data.begin = SVar2.end;
    local_80 = (undefined1  [8])SVar2.begin;
    std::vector<char,_std::allocator<char>_>::resize(__return_storage_ptr__,encoding);
    __dest = std::vector<char,_std::allocator<char>_>::data(__return_storage_ptr__);
    __src = local_80;
    __n = Span<char>::size((Span<char> *)local_80);
    memcpy(__dest,(void *)__src,__n);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> Decoder::readArray() {
        size_t arraySize = stream.read<std::uint32_t>();
        size_t encoding = stream.read<std::uint32_t>();
        size_t completeLength = stream.read<std::uint32_t>();

        std::vector<T> buffer;
        if (encoding == 1)
            buffer = decompress<T>(stream.read<char>(completeLength));
        else {
            auto data = stream.read<T>(completeLength);
            buffer.resize(arraySize);
            std::memcpy(buffer.data(), data.begin, data.size() * sizeof(T));
        }

        return buffer;
    }